

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_fusefref(ASMState *as,IRIns *ir,RegSet allow)

{
  byte bVar1;
  ushort uVar2;
  uint8_t uVar3;
  Reg RVar4;
  
  (as->mrm).idx = 0x80;
  if ((ir->field_0).op1 == 0x7fff) {
    (as->mrm).ofs = *(int *)&as->J + (uint)(ir->field_0).op2 * 4 + -0x288;
  }
  else {
    bVar1 = "\f\b\x10\x06,\x10\b\x14\x18\x1c\x06\x10\x06\x18\x06\b\b\b\f"[(uint)(ir->field_0).op2];
    (as->mrm).ofs = (uint)bVar1;
    uVar2 = (ir->field_0).op1;
    if ((long)(short)uVar2 < 0) {
      RVar4 = ra_alloc1(as,(uint)uVar2,allow);
      uVar3 = (uint8_t)RVar4;
      goto LAB_001464c8;
    }
    (as->mrm).ofs = (uint)bVar1 + as->ir[(short)uVar2].field_1.op12;
  }
  uVar3 = 0x80;
LAB_001464c8:
  (as->mrm).base = uVar3;
  return;
}

Assistant:

static void asm_fusefref(ASMState *as, IRIns *ir, RegSet allow)
{
  lj_assertA(ir->o == IR_FLOAD || ir->o == IR_FREF,
	     "bad IR op %d", ir->o);
  as->mrm.idx = RID_NONE;
  if (ir->op1 == REF_NIL) {  /* FLOAD from GG_State with offset. */
#if LJ_GC64
    as->mrm.ofs = (int32_t)(ir->op2 << 2) - GG_OFS(dispatch);
    as->mrm.base = RID_DISPATCH;
#else
    as->mrm.ofs = (int32_t)(ir->op2 << 2) + ptr2addr(J2GG(as->J));
    as->mrm.base = RID_NONE;
#endif
    return;
  }
  as->mrm.ofs = field_ofs[ir->op2];
  if (irref_isk(ir->op1)) {
    IRIns *op1 = IR(ir->op1);
#if LJ_GC64
    if (ir->op1 == REF_NIL) {
      as->mrm.ofs -= GG_OFS(dispatch);
      as->mrm.base = RID_DISPATCH;
      return;
    } else if (op1->o == IR_KPTR || op1->o == IR_KKPTR) {
      intptr_t ofs = dispofs(as, ir_kptr(op1));
      if (checki32(as->mrm.ofs + ofs)) {
	as->mrm.ofs += (int32_t)ofs;
	as->mrm.base = RID_DISPATCH;
	return;
      }
    }
#else
    as->mrm.ofs += op1->i;
    as->mrm.base = RID_NONE;
    return;
#endif
  }
  as->mrm.base = (uint8_t)ra_alloc1(as, ir->op1, allow);
}